

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoIP.c
# Opt level: O1

GeoIPRegion * GeoIP_region_by_addr(GeoIP *gi,char *addr)

{
  unsigned_long ipnum;
  GeoIPRegion *pGVar1;
  
  if (addr != (char *)0x0) {
    if ((byte)(gi->databaseType | 4U) == 7) {
      ipnum = _GeoIP_addr_to_num(addr);
      pGVar1 = _get_region(gi,ipnum);
      return pGVar1;
    }
    printf("Invalid database type %s, expected %s\n",GeoIPDBDescription[gi->databaseType],
           GeoIPDBDescription[3]);
  }
  return (GeoIPRegion *)0x0;
}

Assistant:

GeoIPRegion * GeoIP_region_by_addr (GeoIP* gi, const char *addr) {
	unsigned long ipnum;
	if (addr == NULL) {
		return 0;
	}
	if (gi->databaseType != GEOIP_REGION_EDITION_REV0 &&
			gi->databaseType != GEOIP_REGION_EDITION_REV1) {
		printf("Invalid database type %s, expected %s\n", GeoIPDBDescription[(int)gi->databaseType], GeoIPDBDescription[GEOIP_REGION_EDITION_REV1]);
		return 0;
	}
	ipnum = _GeoIP_addr_to_num(addr);
	return _get_region(gi, ipnum);
}